

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_short>
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  store_t_conflict1 sVar1;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  int *in_RDI;
  store_t_conflict sVar2;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long i;
  long k;
  int j;
  long local_28;
  long local_20;
  int local_14;
  
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(in_RSI);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(in_RSI);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(in_RSI);
  setSize((Image<float,_gimage::PixelTraits<float>_> *)i,in_stack_00000018,in_stack_00000010,
          in_stack_00000008);
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    for (local_20 = 0; local_20 < *(long *)(in_RDI + 4); local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < *(long *)(in_RDI + 2); local_28 = local_28 + 1) {
        sVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                          (in_RSI,local_28,local_20,local_14);
        sVar2 = PixelTraits<float>::limit((float)sVar1);
        *(store_t_conflict *)
         (*(long *)(*(long *)(*(long *)(in_RDI + 0xc) + (long)local_14 * 8) + local_20 * 8) +
         local_28 * 4) = sVar2;
      }
    }
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }